

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

void __kmp_api_omp_get_schedule(kmp_sched_t *kind,int *modifier)

{
  int gtid;
  
  gtid = __kmp_get_global_thread_id_reg();
  __kmp_get_schedule(gtid,kind,modifier);
  return;
}

Assistant:

void FTN_STDCALL
xexpand(FTN_GET_SCHEDULE)( kmp_sched_t * kind, int * modifier )
{
    #ifdef KMP_STUB
        __kmps_get_schedule( kind, modifier );
    #else
	/*  TO DO  */
	/* For the per-task implementation of the internal controls */
        __kmp_get_schedule( __kmp_entry_gtid(), kind, modifier );
    #endif
}